

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<double> __thiscall qclab::dense::eye<double>(dense *this,int64_t size)

{
  double *pdVar1;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> extraout_RDX;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> _Var2;
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX_00;
  SquareMatrix<double> SVar3;
  undefined8 local_28;
  int64_t i;
  int64_t size_local;
  SquareMatrix<double> *mat;
  
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,size,0.0);
  _Var2._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (tuple<double_*,_std::default_delete<double[]>_>)
       extraout_RDX.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    pdVar1 = SquareMatrix<double>::operator()((SquareMatrix<double> *)this,local_28,local_28);
    *pdVar1 = 1.0;
    _Var2._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
  }
  SVar3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       _Var2._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }